

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O1

void __thiscall
BamTools::ConvertTool::ConvertToolPrivate::PrintYaml(ConvertToolPrivate *this,BamAlignment *a)

{
  ostream *this_00;
  pointer pRVar1;
  pointer pCVar2;
  char cVar3;
  ostream *poVar4;
  long *plVar5;
  CigarOp *op;
  pointer pCVar6;
  char local_2a [2];
  
  this_00 = &this->m_out;
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"---",3);
  cVar3 = (char)this_00;
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->m_out + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (this_00,(a->Name)._M_dataplus._M_p,(a->Name)._M_string_length);
  local_2a[1] = 0x3a;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2a + 1,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"   ",3);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"AlndBases: ",0xb);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (this_00,(a->AlignedBases)._M_dataplus._M_p,(a->AlignedBases)._M_string_length)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"   ",3);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"Qualities: ",0xb);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (this_00,(a->Qualities)._M_dataplus._M_p,(a->Qualities)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"   ",3);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"Name: ",6);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (this_00,(a->Name)._M_dataplus._M_p,(a->Name)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"   ",3);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"Length: ",8);
  plVar5 = (long *)std::ostream::operator<<(this_00,a->Length);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"   ",3);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"TagData: ",9);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (this_00,(a->TagData)._M_dataplus._M_p,(a->TagData)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"   ",3);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"RefID: ",7);
  plVar5 = (long *)std::ostream::operator<<(this_00,a->RefID);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"   ",3);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"RefName: ",9);
  pRVar1 = (this->m_references).
           super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl.
           super__Vector_impl_data._M_start;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (this_00,pRVar1[a->RefID].RefName._M_dataplus._M_p,
                      pRVar1[a->RefID].RefName._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"   ",3);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"Position: ",10);
  plVar5 = (long *)std::ostream::operator<<(this_00,a->Position);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"   ",3);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"Bin: ",5);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"   ",3);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"MapQuality: ",0xc);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"   ",3);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"AlignmentFlag: ",0xf);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"   ",3);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"MateRefID: ",0xb);
  plVar5 = (long *)std::ostream::operator<<(this_00,a->MateRefID);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"   ",3);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"MatePosition: ",0xe);
  plVar5 = (long *)std::ostream::operator<<(this_00,a->MatePosition);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"   ",3);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"InsertSize: ",0xc);
  plVar5 = (long *)std::ostream::operator<<(this_00,a->InsertSize);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"   ",3);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"Filename: ",10);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (this_00,(a->Filename)._M_dataplus._M_p,(a->Filename)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if ((a->CigarData).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (a->CigarData).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>(this_00,"   ",3);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,"Cigar: ",7);
    pCVar6 = (a->CigarData).
             super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
             super__Vector_impl_data._M_start;
    pCVar2 = (a->CigarData).
             super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pCVar6 != pCVar2) {
      do {
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        local_2a[0] = pCVar6->Type;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2a,1);
        pCVar6 = pCVar6 + 1;
      } while (pCVar6 != pCVar2);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)this_00 + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
  }
  return;
}

Assistant:

void ConvertTool::ConvertToolPrivate::PrintYaml(const BamAlignment& a)
{

    // write alignment name
    m_out << "---" << std::endl;
    m_out << a.Name << ':' << std::endl;

    // write alignment data
    m_out << "   "
          << "AlndBases: " << a.AlignedBases << std::endl;
    m_out << "   "
          << "Qualities: " << a.Qualities << std::endl;
    m_out << "   "
          << "Name: " << a.Name << std::endl;
    m_out << "   "
          << "Length: " << a.Length << std::endl;
    m_out << "   "
          << "TagData: " << a.TagData << std::endl;
    m_out << "   "
          << "RefID: " << a.RefID << std::endl;
    m_out << "   "
          << "RefName: " << m_references[a.RefID].RefName << std::endl;
    m_out << "   "
          << "Position: " << a.Position << std::endl;
    m_out << "   "
          << "Bin: " << a.Bin << std::endl;
    m_out << "   "
          << "MapQuality: " << a.MapQuality << std::endl;
    m_out << "   "
          << "AlignmentFlag: " << a.AlignmentFlag << std::endl;
    m_out << "   "
          << "MateRefID: " << a.MateRefID << std::endl;
    m_out << "   "
          << "MatePosition: " << a.MatePosition << std::endl;
    m_out << "   "
          << "InsertSize: " << a.InsertSize << std::endl;
    m_out << "   "
          << "Filename: " << a.Filename << std::endl;

    // write Cigar data
    const std::vector<CigarOp>& cigarData = a.CigarData;
    if (!cigarData.empty()) {
        m_out << "   "
              << "Cigar: ";
        std::vector<CigarOp>::const_iterator cigarBegin = cigarData.begin();
        std::vector<CigarOp>::const_iterator cigarIter = cigarBegin;
        std::vector<CigarOp>::const_iterator cigarEnd = cigarData.end();
        for (; cigarIter != cigarEnd; ++cigarIter) {
            const CigarOp& op = (*cigarIter);
            m_out << op.Length << op.Type;
        }
        m_out << std::endl;
    }
}